

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

void __thiscall
cmCustomCommandGenerator::AppendArguments(cmCustomCommandGenerator *this,uint c,string *cmd)

{
  cmLocalGenerator *pcVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_reference pvVar6;
  char *local_140;
  string local_110;
  string local_f0;
  char *local_d0;
  char *location;
  string arg;
  uint j_1;
  cmCustomCommandLine *commandLine;
  string local_78;
  uint local_44;
  undefined1 local_40 [4];
  uint j;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emulator;
  uint offset;
  string *cmd_local;
  uint c_local;
  cmCustomCommandGenerator *this_local;
  
  emulator.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  GetCrossCompilingEmulator_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40,this,c);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_40);
  if (!bVar2) {
    local_44 = 1;
    while( true ) {
      uVar3 = (ulong)local_44;
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40);
      if (sVar4 <= uVar3) break;
      std::__cxx11::string::operator+=((string *)cmd," ");
      if ((this->OldStyle & 1U) == 0) {
        pcVar1 = this->LG;
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40,(ulong)local_44);
        cmOutputConverter::EscapeForShell
                  ((string *)&commandLine,&pcVar1->super_cmOutputConverter,pvVar5,
                   (bool)(this->MakeVars & 1),false,false);
        std::__cxx11::string::operator+=((string *)cmd,(string *)&commandLine);
        std::__cxx11::string::~string((string *)&commandLine);
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40,(ulong)local_44);
        escapeForShellOldStyle(&local_78,pvVar5);
        std::__cxx11::string::operator+=((string *)cmd,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      local_44 = local_44 + 1;
    }
    emulator.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  this_00 = &std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::operator[]
                       (&(this->CommandLines).
                         super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                        (ulong)c)->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  arg.field_2._12_4_ =
       emulator.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  while( true ) {
    uVar3 = (ulong)(uint)arg.field_2._12_4_;
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(this_00);
    if (sVar4 <= uVar3) break;
    std::__cxx11::string::string((string *)&location);
    if (arg.field_2._12_4_ == 0) {
      local_140 = GetArgv0Location(this,c);
    }
    else {
      local_140 = (char *)0x0;
    }
    local_d0 = local_140;
    if (local_140 == (char *)0x0) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this_00,(ulong)(uint)arg.field_2._12_4_);
      std::__cxx11::string::operator=((string *)&location,(string *)pvVar6);
    }
    else {
      std::__cxx11::string::operator=((string *)&location,local_140);
    }
    std::__cxx11::string::operator+=((string *)cmd," ");
    if ((this->OldStyle & 1U) == 0) {
      cmOutputConverter::EscapeForShell
                (&local_110,&this->LG->super_cmOutputConverter,(string *)&location,
                 (bool)(this->MakeVars & 1),false,false);
      std::__cxx11::string::operator+=((string *)cmd,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
    }
    else {
      escapeForShellOldStyle(&local_f0,(string *)&location);
      std::__cxx11::string::operator+=((string *)cmd,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    std::__cxx11::string::~string((string *)&location);
    arg.field_2._12_4_ = arg.field_2._12_4_ + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return;
}

Assistant:

void cmCustomCommandGenerator::AppendArguments(unsigned int c,
                                               std::string& cmd) const
{
  unsigned int offset = 1;
  std::vector<std::string> emulator = this->GetCrossCompilingEmulator(c);
  if (!emulator.empty()) {
    for (unsigned j = 1; j < emulator.size(); ++j) {
      cmd += " ";
      if (this->OldStyle) {
        cmd += escapeForShellOldStyle(emulator[j]);
      } else {
        cmd += this->LG->EscapeForShell(emulator[j], this->MakeVars);
      }
    }

    offset = 0;
  }

  cmCustomCommandLine const& commandLine = this->CommandLines[c];
  for (unsigned int j = offset; j < commandLine.size(); ++j) {
    std::string arg;
    if (const char* location = j == 0 ? this->GetArgv0Location(c) : nullptr) {
      // GetCommand returned the emulator instead of the argv0 location,
      // so transform the latter now.
      arg = location;
    } else {
      arg = commandLine[j];
    }
    cmd += " ";
    if (this->OldStyle) {
      cmd += escapeForShellOldStyle(arg);
    } else {
      cmd += this->LG->EscapeForShell(arg, this->MakeVars);
    }
  }
}